

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_legacy_uniform(CompilerHLSL *this,SPIRVariable *var)

{
  uint32_t id;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  SPIRType *local_20;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  local_20 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  if ((local_20->basetype | Boolean) != Sampler) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_50,this,type);
    CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_50,(char (*) [2])0x4af37c);
    ::std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Separate image and samplers not supported in legacy HLSL.");
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerHLSL::emit_legacy_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	switch (type.basetype)
	{
	case SPIRType::Sampler:
	case SPIRType::Image:
		SPIRV_CROSS_THROW("Separate image and samplers not supported in legacy HLSL.");

	default:
		statement(variable_decl(var), ";");
		break;
	}
}